

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

ArgumentsValue * __thiscall
minja::ArgumentsExpression::evaluate(ArgumentsExpression *this,shared_ptr<minja::Context> *context)

{
  bool bVar1;
  element_type *peVar2;
  runtime_error *prVar3;
  long in_RSI;
  ArgumentsValue *in_RDI;
  type *value;
  type *name;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
  *__range2_1;
  Value dict;
  Value array;
  shared_ptr<minja::UnaryOpExpr> un_expr;
  shared_ptr<minja::Expression> *arg;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
  *__range2;
  ArgumentsValue *vargs;
  value_type *in_stack_fffffffffffffd08;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_minja::Value>
  *in_stack_fffffffffffffd10;
  ArgumentsValue *in_stack_fffffffffffffd18;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_minja::Value>
  *in_stack_fffffffffffffd20;
  shared_ptr<minja::Expression> *in_stack_fffffffffffffd28;
  __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>_>
  local_1c0;
  long local_1b8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_minja::Value>
  *local_158;
  shared_ptr<minja::Expression> local_150 [2];
  function<void_(minja::Value_&)> *in_stack_fffffffffffffed8;
  undefined8 in_stack_fffffffffffffee0;
  element_type *in_stack_fffffffffffffef0;
  __weak_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffef8;
  int local_dc;
  __shared_ptr local_50 [16];
  reference local_40;
  shared_ptr<minja::Expression> *local_38;
  __normal_iterator<const_std::shared_ptr<minja::Expression>_*,_std::vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>_>
  local_30 [2];
  undefined1 local_19;
  
  local_19 = 0;
  ArgumentsValue::ArgumentsValue((ArgumentsValue *)in_stack_fffffffffffffd10);
  local_30[0]._M_current =
       (shared_ptr<minja::Expression> *)
       std::
       vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
       ::begin((vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
                *)in_stack_fffffffffffffd08);
  local_38 = (shared_ptr<minja::Expression> *)
             std::
             vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
             ::end((vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
                    *)in_stack_fffffffffffffd08);
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::shared_ptr<minja::Expression>_*,_std::vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>_>
                        *)in_stack_fffffffffffffd10,
                       (__normal_iterator<const_std::shared_ptr<minja::Expression>_*,_std::vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>_>
                        *)in_stack_fffffffffffffd08);
    if (!bVar1) {
      local_1b8 = in_RSI + 0x18;
      local_1c0._M_current =
           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>
            *)std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
              ::begin((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
                       *)in_stack_fffffffffffffd08);
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
      ::end((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
             *)in_stack_fffffffffffffd08);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>_>
                                 *)in_stack_fffffffffffffd10,
                                (__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>_>
                                 *)in_stack_fffffffffffffd08), bVar1) {
        __gnu_cxx::
        __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>_>
        ::operator*(&local_1c0);
        in_stack_fffffffffffffd10 =
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_minja::Value>
              *)std::get<0ul,std::__cxx11::string,std::shared_ptr<minja::Expression>>
                          ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>
                            *)0x30c120);
        std::get<1ul,std::__cxx11::string,std::shared_ptr<minja::Expression>>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>
                    *)0x30c135);
        in_stack_fffffffffffffd08 = (value_type *)&in_RDI->kwargs;
        std::__shared_ptr_access<minja::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<minja::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x30c167);
        Expression::evaluate
                  ((Expression *)in_stack_fffffffffffffef8._M_pi,
                   (shared_ptr<minja::Context> *)in_stack_fffffffffffffef0);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_minja::Value>
        ::pair<minja::Value,_true>
                  (in_stack_fffffffffffffd20,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd18,(Value *)in_stack_fffffffffffffd10);
        std::
        vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_minja::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_minja::Value>_>_>
        ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_minja::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_minja::Value>_>_>
                     *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_minja::Value>
        ::~pair(in_stack_fffffffffffffd10);
        Value::~Value((Value *)in_stack_fffffffffffffd10);
        __gnu_cxx::
        __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>_>
        ::operator++(&local_1c0);
      }
      return in_RDI;
    }
    local_40 = __gnu_cxx::
               __normal_iterator<const_std::shared_ptr<minja::Expression>_*,_std::vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>_>
               ::operator*(local_30);
    std::dynamic_pointer_cast<minja::UnaryOpExpr,minja::Expression>(in_stack_fffffffffffffd28);
    bVar1 = std::__shared_ptr::operator_cast_to_bool(local_50);
    if (bVar1) {
      peVar2 = std::
               __shared_ptr_access<minja::UnaryOpExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<minja::UnaryOpExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x30bcc8);
      if (peVar2->op == Expansion) {
        std::__shared_ptr_access<minja::UnaryOpExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<minja::UnaryOpExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x30bcdf);
        std::__shared_ptr_access<minja::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<minja::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x30bceb);
        Expression::evaluate
                  ((Expression *)in_stack_fffffffffffffef8._M_pi,
                   (shared_ptr<minja::Context> *)in_stack_fffffffffffffef0);
        bVar1 = Value::is_array((Value *)0x30bd12);
        if (!bVar1) {
          prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar3,"Expansion operator only supported on arrays");
          __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        std::function<void(minja::Value&)>::
        function<minja::ArgumentsExpression::evaluate(std::shared_ptr<minja::Context>const&)const::_lambda(minja::Value&)_1_,void>
                  ((function<void_(minja::Value_&)> *)in_stack_fffffffffffffd20,
                   (anon_class_8_1_a8c69573 *)in_stack_fffffffffffffd18);
        Value::for_each((Value *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
        std::function<void_(minja::Value_&)>::~function((function<void_(minja::Value_&)> *)0x30bdf7)
        ;
        local_dc = 3;
        Value::~Value((Value *)in_stack_fffffffffffffd10);
      }
      else {
        peVar2 = std::
                 __shared_ptr_access<minja::UnaryOpExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<minja::UnaryOpExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x30be54);
        if (peVar2->op != ExpansionDict) goto LAB_0030bfc9;
        std::__shared_ptr_access<minja::UnaryOpExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<minja::UnaryOpExpr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x30be6b);
        std::__shared_ptr_access<minja::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<minja::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x30be77);
        Expression::evaluate
                  ((Expression *)in_stack_fffffffffffffef8._M_pi,
                   (shared_ptr<minja::Context> *)in_stack_fffffffffffffef0);
        bVar1 = Value::is_object((Value *)0x30be9e);
        if (!bVar1) {
          prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (prVar3,"ExpansionDict operator only supported on objects");
          __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        in_stack_fffffffffffffd20 =
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_minja::Value>
              *)&stack0xfffffffffffffed0;
        in_stack_fffffffffffffd28 = local_150;
        local_158 = in_stack_fffffffffffffd20;
        std::function<void(minja::Value&)>::
        function<minja::ArgumentsExpression::evaluate(std::shared_ptr<minja::Context>const&)const::_lambda(minja::Value_const&)_1_,void>
                  ((function<void_(minja::Value_&)> *)in_stack_fffffffffffffd20,
                   (anon_class_16_2_073d967a *)in_stack_fffffffffffffd18);
        Value::for_each((Value *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
        std::function<void_(minja::Value_&)>::~function((function<void_(minja::Value_&)> *)0x30bf78)
        ;
        local_dc = 3;
        Value::~Value((Value *)in_stack_fffffffffffffd10);
      }
    }
    else {
LAB_0030bfc9:
      local_dc = 0;
    }
    std::shared_ptr<minja::UnaryOpExpr>::~shared_ptr((shared_ptr<minja::UnaryOpExpr> *)0x30bfe1);
    if (local_dc == 0) {
      in_stack_fffffffffffffd18 = in_RDI;
      std::__shared_ptr_access<minja::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<minja::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )0x30c007);
      Expression::evaluate
                ((Expression *)in_stack_fffffffffffffef8._M_pi,
                 (shared_ptr<minja::Context> *)in_stack_fffffffffffffef0);
      std::vector<minja::Value,_std::allocator<minja::Value>_>::push_back
                ((vector<minja::Value,_std::allocator<minja::Value>_> *)in_stack_fffffffffffffd10,
                 (value_type *)in_stack_fffffffffffffd08);
      Value::~Value((Value *)in_stack_fffffffffffffd10);
    }
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<minja::Expression>_*,_std::vector<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>_>
    ::operator++(local_30);
  } while( true );
}

Assistant:

ArgumentsValue evaluate(const std::shared_ptr<Context> & context) const {
        ArgumentsValue vargs;
        for (const auto& arg : this->args) {
            if (auto un_expr = std::dynamic_pointer_cast<UnaryOpExpr>(arg)) {
                if (un_expr->op == UnaryOpExpr::Op::Expansion) {
                    auto array = un_expr->expr->evaluate(context);
                    if (!array.is_array()) {
                        throw std::runtime_error("Expansion operator only supported on arrays");
                    }
                    array.for_each([&](Value & value) {
                        vargs.args.push_back(value);
                    });
                    continue;
                } else if (un_expr->op == UnaryOpExpr::Op::ExpansionDict) {
                    auto dict = un_expr->expr->evaluate(context);
                    if (!dict.is_object()) {
                        throw std::runtime_error("ExpansionDict operator only supported on objects");
                    }
                    dict.for_each([&](const Value & key) {
                        vargs.kwargs.push_back({key.get<std::string>(), dict.at(key)});
                    });
                    continue;
                }
            }
            vargs.args.push_back(arg->evaluate(context));
        }
        for (const auto& [name, value] : this->kwargs) {
            vargs.kwargs.push_back({name, value->evaluate(context)});
        }
        return vargs;
    }